

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O1

void Mvc_CoverDivideByLiteral
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  Mvc_Cube_t *pMVar1;
  byte bVar2;
  int *piVar3;
  Mvc_Cover_t *pMVar4;
  int iVar5;
  Mvc_Cover_t *pMVar6;
  Mvc_Cover_t *pMVar7;
  Mvc_Cube_t *pMVar8;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar9;
  Mvc_List_t *pList;
  Mvc_List_t *pList_1;
  
  iVar5 = Mvc_CoverReadCubeNum(pDiv);
  if (iVar5 == 1) {
    pMVar6 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    pMVar7 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    iVar5 = Mvc_CoverFirstCubeFirstLit(pDiv);
    pCube = (pCover->lCubes).pHead;
    if (pCube != (Mvc_Cube_t *)0x0) {
      bVar2 = (byte)iVar5 & 0x1f;
      do {
        pMVar8 = Mvc_CubeDup(pCover,pCube);
        if ((pMVar8->pData[iVar5 >> 5] & 1 << ((byte)iVar5 & 0x1f)) == 0) {
          pMVar1 = (pMVar7->lCubes).pHead;
          pMVar9 = (Mvc_Cube_t *)&pMVar7->lCubes;
          pMVar4 = pMVar7;
        }
        else {
          pMVar8->pData[iVar5 >> 5] =
               pMVar8->pData[iVar5 >> 5] & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          pMVar1 = (pMVar6->lCubes).pHead;
          pMVar9 = (Mvc_Cube_t *)&pMVar6->lCubes;
          pMVar4 = pMVar6;
        }
        piVar3 = &(pMVar4->lCubes).nItems;
        if (pMVar1 != (Mvc_Cube_t *)0x0) {
          pMVar9 = (pMVar4->lCubes).pTail;
        }
        pMVar9->pNext = pMVar8;
        (pMVar4->lCubes).pTail = pMVar8;
        pMVar8->pNext = (Mvc_Cube_t *)0x0;
        *piVar3 = *piVar3 + 1;
        pCube = pCube->pNext;
      } while (pCube != (Mvc_Cube_t *)0x0);
    }
    *ppRem = pMVar7;
    *ppQuo = pMVar6;
    return;
  }
  __assert_fail("Mvc_CoverReadCubeNum(pDiv) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mvc/mvcDivide.c"
                ,0x14a,
                "void Mvc_CoverDivideByLiteral(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
               );
}

Assistant:

void Mvc_CoverDivideByLiteral( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeCopy;
    int iLit;

    // get the only cube of D
    assert( Mvc_CoverReadCubeNum(pDiv) == 1 );

    // start the quotient and the remainder
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the first and only literal in the divisor cube
    iLit = Mvc_CoverFirstCubeFirstLit( pDiv );

    // iterate through the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCubeC )
    {
        // copy the cube
        pCubeCopy = Mvc_CubeDup( pCover, pCubeC );
        // add the cube to the quotient or to the remainder depending on the literal
        if ( Mvc_CubeBitValue( pCubeCopy, iLit ) )
        {   // remove the literal
            Mvc_CubeBitRemove( pCubeCopy, iLit );
            // add the cube ot the quotient
            Mvc_CoverAddCubeTail( pQuo, pCubeCopy );
        }
        else
        {   // add the cube ot the remainder
            Mvc_CoverAddCubeTail( pRem, pCubeCopy );
        }
    }
    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
}